

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::DefaultRsCaseItemSyntax::setChild
          (DefaultRsCaseItemSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_002576e0 + *(int *)(&DAT_002576e0 + index * 4)))();
  return;
}

Assistant:

void DefaultRsCaseItemSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: defaultKeyword = child.token(); return;
        case 1: colon = child.token(); return;
        case 2: item = child.node() ? &child.node()->as<RsProdItemSyntax>() : nullptr; return;
        case 3: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}